

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg.c
# Opt level: O0

void tcg_op_remove_mips(TCGContext_conflict3 *s,TCGOp *op)

{
  char cVar1;
  TCGLabel *pTVar2;
  TCGLabel *label;
  TCGOp *op_local;
  TCGContext_conflict3 *s_local;
  
  cVar1 = *(char *)op;
  if (cVar1 == '\x03') {
    pTVar2 = arg_label(op->args[0]);
    *(uint *)pTVar2 = *(uint *)pTVar2 & 0xffff | ((*(uint *)pTVar2 >> 0x10) - 1) * 0x10000;
    goto LAB_0091a392;
  }
  if (cVar1 != '&') {
    if (cVar1 == '-') {
      pTVar2 = arg_label(op->args[5]);
      *(uint *)pTVar2 = *(uint *)pTVar2 & 0xffff | ((*(uint *)pTVar2 >> 0x10) - 1) * 0x10000;
      goto LAB_0091a392;
    }
    if (cVar1 != 'g') goto LAB_0091a392;
  }
  pTVar2 = arg_label(op->args[3]);
  *(uint *)pTVar2 = *(uint *)pTVar2 & 0xffff | ((*(uint *)pTVar2 >> 0x10) - 1) * 0x10000;
LAB_0091a392:
  if ((op->link).tqe_next == (TCGOp *)0x0) {
    (s->ops).tqh_circ.tql_prev = (op->link).tqe_circ.tql_prev;
  }
  else {
    (((op->link).tqe_next)->link).tqe_circ.tql_prev = (op->link).tqe_circ.tql_prev;
  }
  ((op->link).tqe_circ.tql_prev)->tql_next = (op->link).tqe_next;
  (op->link).tqe_circ.tql_prev = (QTailQLink *)0x0;
  (op->link).tqe_next = (TCGOp *)0x0;
  (op->link).tqe_next = (TCGOp *)0x0;
  (op->link).tqe_next = (TCGOp *)0x0;
  (op->link).tqe_circ.tql_prev = (s->free_ops).tqh_circ.tql_prev;
  ((s->free_ops).tqh_circ.tql_prev)->tql_next = op;
  (s->free_ops).tqh_circ.tql_prev = (QTailQLink *)&op->link;
  s->nb_ops = s->nb_ops + -1;
  return;
}

Assistant:

void tcg_op_remove(TCGContext *s, TCGOp *op)
{
    TCGLabel *label;

    switch (op->opc) {
    case INDEX_op_br:
        label = arg_label(op->args[0]);
        label->refs--;
        break;
    case INDEX_op_brcond_i32:
    case INDEX_op_brcond_i64:
        label = arg_label(op->args[3]);
        label->refs--;
        break;
    case INDEX_op_brcond2_i32:
        label = arg_label(op->args[5]);
        label->refs--;
        break;
    default:
        break;
    }

    QTAILQ_REMOVE(&s->ops, op, link);
    QTAILQ_INSERT_TAIL(&s->free_ops, op, link);
    s->nb_ops--;
}